

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseMessageBlock
          (Parser *this,DescriptorProto *message,LocationRecorder *message_location,
          FileDescriptorProto *containing_file)

{
  ErrorCollector *pEVar1;
  bool bVar2;
  bool bVar3;
  Type *pTVar4;
  Type *pTVar5;
  int iVar6;
  int32_t iVar7;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  bVar2 = ConsumeEndOfDeclaration(this,"{",message_location);
  if (bVar2) {
    bVar2 = TryConsumeEndOfDeclaration(this,"}",(LocationRecorder *)0x0);
    while (!bVar2) {
      if ((this->input_->current_).type == TYPE_END) {
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,"Reached end of input in message definition (missing \'}\').",
                   "");
        pEVar1 = this->error_collector_;
        if (pEVar1 != (ErrorCollector *)0x0) {
          (*pEVar1->_vptr_ErrorCollector[2])
                    (pEVar1,(ulong)(uint)(this->input_->current_).line,
                     (ulong)(uint)(this->input_->current_).column,local_50);
        }
        this->had_errors_ = true;
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        goto LAB_0033caf8;
      }
      bVar2 = ParseMessageStatement(this,message,message_location,containing_file);
      if (!bVar2) {
        SkipStatement(this);
      }
      bVar2 = TryConsumeEndOfDeclaration(this,"}",(LocationRecorder *)0x0);
    }
    if (0 < (message->extension_range_).super_RepeatedPtrFieldBase.current_size_) {
      bVar2 = anon_unknown_0::IsMessageSetWireFormatMessage((DescriptorProto *)message->options_);
      iVar7 = 0x20000000;
      if (bVar2) {
        iVar7 = 0x7fffffff;
      }
      if (0 < (message->extension_range_).super_RepeatedPtrFieldBase.current_size_) {
        iVar6 = 0;
        do {
          pTVar4 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                             (&(message->extension_range_).super_RepeatedPtrFieldBase,iVar6);
          if (pTVar4->end_ == -1) {
            pTVar4 = internal::RepeatedPtrFieldBase::
                     Mutable<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                               (&(message->extension_range_).super_RepeatedPtrFieldBase,iVar6);
            *(byte *)(pTVar4->_has_bits_).has_bits_ = (byte)(pTVar4->_has_bits_).has_bits_[0] | 4;
            pTVar4->end_ = iVar7;
          }
          iVar6 = iVar6 + 1;
        } while (iVar6 < (message->extension_range_).super_RepeatedPtrFieldBase.current_size_);
      }
    }
    bVar2 = true;
    if (0 < (message->reserved_range_).super_RepeatedPtrFieldBase.current_size_) {
      bVar3 = anon_unknown_0::IsMessageSetWireFormatMessage((DescriptorProto *)message->options_);
      iVar7 = 0x20000000;
      if (bVar3) {
        iVar7 = 0x7fffffff;
      }
      if (0 < (message->reserved_range_).super_RepeatedPtrFieldBase.current_size_) {
        iVar6 = 0;
        do {
          pTVar5 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::TypeHandler>
                             (&(message->reserved_range_).super_RepeatedPtrFieldBase,iVar6);
          if (pTVar5->end_ == -1) {
            pTVar5 = internal::RepeatedPtrFieldBase::
                     Mutable<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::TypeHandler>
                               (&(message->reserved_range_).super_RepeatedPtrFieldBase,iVar6);
            *(byte *)(pTVar5->_has_bits_).has_bits_ = (byte)(pTVar5->_has_bits_).has_bits_[0] | 2;
            pTVar5->end_ = iVar7;
          }
          iVar6 = iVar6 + 1;
        } while (iVar6 < (message->reserved_range_).super_RepeatedPtrFieldBase.current_size_);
      }
    }
  }
  else {
LAB_0033caf8:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Parser::ParseMessageBlock(DescriptorProto* message,
                               const LocationRecorder& message_location,
                               const FileDescriptorProto* containing_file) {
  DO(ConsumeEndOfDeclaration("{", &message_location));

  while (!TryConsumeEndOfDeclaration("}", NULL)) {
    if (AtEnd()) {
      AddError("Reached end of input in message definition (missing '}').");
      return false;
    }

    if (!ParseMessageStatement(message, message_location, containing_file)) {
      // This statement failed to parse.  Skip it, but keep looping to parse
      // other statements.
      SkipStatement();
    }
  }

  if (message->extension_range_size() > 0) {
    AdjustExtensionRangesWithMaxEndNumber(message);
  }
  if (message->reserved_range_size() > 0) {
    AdjustReservedRangesWithMaxEndNumber(message);
  }
  return true;
}